

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

void Js::DynamicProfileInfo::DumpProfiledValue
               (char16 *name,ArrayCallSiteInfo *arrayCallSiteInfo,uint count)

{
  ProfileId *pPVar1;
  char16_t *form;
  ulong uVar2;
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name);
    Output::Print(L"\n");
    pPVar1 = &arrayCallSiteInfo->callSiteNumber;
    uVar2 = 0;
    do {
      form = L" ";
      if ((uVar2 != 0) &&
         (form = L"\n                          ",
         (int)((uVar2 & 0xffffffff) / 10) * -10 + (int)uVar2 != 0)) {
        form = L" ";
      }
      Output::Print(form);
      Output::Print(L"%4d:",uVar2 & 0xffffffff);
      Output::Print(L"  Function Number:  %2d, CallSite Number:  %2d, IsNativeIntArray:  %2d, IsNativeFloatArray:  %2d"
                    ,(ulong)*(uint *)(pPVar1 + -2),(ulong)*pPVar1,
                    (ulong)(~*(uint *)(pPVar1 + -4) & 1),(ulong)((*(uint *)(pPVar1 + -4) & 2) == 0))
      ;
      Output::Print(L"\n");
      uVar2 = uVar2 + 1;
      pPVar1 = pPVar1 + 6;
    } while (count != uVar2);
    Output::Print(L"\n");
    return;
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, ArrayCallSiteInfo * arrayCallSiteInfo, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            Output::Print(_u("\n"));
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%4d:"), i);
                Output::Print(_u("  Function Number:  %2d, CallSite Number:  %2d, IsNativeIntArray:  %2d, IsNativeFloatArray:  %2d"),
                    arrayCallSiteInfo[i].functionNumber, arrayCallSiteInfo[i].callSiteNumber, !arrayCallSiteInfo[i].isNotNativeInt, !arrayCallSiteInfo[i].isNotNativeFloat);
                Output::Print(_u("\n"));
            }
            Output::Print(_u("\n"));
        }
    }